

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadBinaryFile(COBImporter *this,Scene *out,StreamReaderLE *reader)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  COBImporter *pCVar7;
  string type;
  ChunkInfo local_68;
  undefined1 local_50 [32];
  
  if (reader != (StreamReaderLE *)0x0) {
    do {
      local_50._8_8_ = 0;
      local_50[0x10] = _S_red;
      local_50._0_8_ = local_50 + 0x10;
      StreamReader<false,_false>::Get<signed_char>(reader);
      cVar6 = (char)(COBImporter *)local_50;
      std::__cxx11::string::push_back(cVar6);
      StreamReader<false,_false>::Get<signed_char>(reader);
      std::__cxx11::string::push_back(cVar6);
      StreamReader<false,_false>::Get<signed_char>(reader);
      std::__cxx11::string::push_back(cVar6);
      StreamReader<false,_false>::Get<signed_char>(reader);
      std::__cxx11::string::push_back(cVar6);
      local_68.id = 0;
      local_68.parent_id = 0;
      local_68.version = 0;
      local_68.size = 0xffffffff;
      sVar2 = StreamReader<false,_false>::Get<short>(reader);
      local_68.version = sVar2 * 10;
      sVar2 = StreamReader<false,_false>::Get<short>(reader);
      local_68.version = local_68.version + (int)sVar2;
      uVar3 = StreamReader<false,_false>::Get<int>(reader);
      local_68.id = uVar3;
      uVar3 = StreamReader<false,_false>::Get<int>(reader);
      local_68.parent_id = uVar3;
      iVar4 = StreamReader<false,_false>::Get<int>(reader);
      local_68.size = iVar4;
      pCVar7 = (COBImporter *)local_50;
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      if (iVar4 == 0) {
        bVar1 = true;
        ReadPolH_Binary(pCVar7,out,reader,&local_68);
      }
      else {
        pcVar5 = "BitM";
        pCVar7 = (COBImporter *)local_50;
        iVar4 = std::__cxx11::string::compare((char *)local_50);
        if (iVar4 == 0) {
          bVar1 = true;
          ReadBitM_Binary(pCVar7,(Scene *)pcVar5,reader,&local_68);
        }
        else {
          pCVar7 = (COBImporter *)local_50;
          iVar4 = std::__cxx11::string::compare((char *)local_50);
          if (iVar4 == 0) {
            bVar1 = true;
            ReadGrou_Binary(pCVar7,out,reader,&local_68);
          }
          else {
            pCVar7 = (COBImporter *)local_50;
            iVar4 = std::__cxx11::string::compare((char *)local_50);
            if (iVar4 == 0) {
              bVar1 = true;
              ReadLght_Binary(pCVar7,out,reader,&local_68);
            }
            else {
              pCVar7 = (COBImporter *)local_50;
              iVar4 = std::__cxx11::string::compare((char *)local_50);
              if (iVar4 == 0) {
                bVar1 = true;
                ReadCame_Binary(pCVar7,out,reader,&local_68);
              }
              else {
                pCVar7 = (COBImporter *)local_50;
                iVar4 = std::__cxx11::string::compare((char *)local_50);
                if (iVar4 == 0) {
                  bVar1 = true;
                  ReadMat1_Binary(pCVar7,out,reader,&local_68);
                }
                else {
                  pCVar7 = (COBImporter *)local_50;
                  iVar4 = std::__cxx11::string::compare((char *)local_50);
                  if (iVar4 == 0) {
                    bVar1 = true;
                    ReadUnit_Binary(pCVar7,out,reader,&local_68);
                  }
                  else {
                    pCVar7 = (COBImporter *)local_50;
                    iVar4 = std::__cxx11::string::compare((char *)local_50);
                    if (iVar4 == 0) {
                      if ((ulong)local_68._8_8_ >> 0x20 == 0xffffffff) {
                        UnsupportedChunk_Binary(pCVar7,reader,&local_68,(char *)local_50._0_8_);
                        goto LAB_004c26be;
                      }
                      bVar1 = true;
                      StreamReader<false,_false>::IncPtr(reader,(ulong)local_68._8_8_ >> 0x20);
                    }
                    else {
                      pCVar7 = (COBImporter *)local_50;
                      iVar4 = std::__cxx11::string::compare((char *)local_50);
                      if (iVar4 == 0) {
LAB_004c26be:
                        bVar1 = false;
                      }
                      else {
                        bVar1 = true;
                        UnsupportedChunk_Binary(pCVar7,reader,&local_68,(char *)local_50._0_8_);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
        operator_delete((void *)local_50._0_8_,CONCAT71(local_50._17_7_,local_50[0x10]) + 1);
      }
    } while (bVar1);
  }
  return;
}

Assistant:

void COBImporter::ReadBinaryFile(Scene& out, StreamReaderLE* reader) {
    if (nullptr == reader) {
        return;
    }

    while(1) {
        std::string type;
         type += reader -> GetI1()
        ,type += reader -> GetI1()
        ,type += reader -> GetI1()
        ,type += reader -> GetI1()
        ;

        ChunkInfo nfo;
        nfo.version  = reader -> GetI2()*10;
        nfo.version += reader -> GetI2();

        nfo.id = reader->GetI4();
        nfo.parent_id = reader->GetI4();
        nfo.size = reader->GetI4();

        if (type == "PolH") {
            ReadPolH_Binary(out,*reader,nfo);
        }
        else if (type == "BitM") {
            ReadBitM_Binary(out,*reader,nfo);
        }
        else if (type == "Grou") {
            ReadGrou_Binary(out,*reader,nfo);
        }
        else if (type == "Lght") {
            ReadLght_Binary(out,*reader,nfo);
        }
        else if (type == "Came") {
            ReadCame_Binary(out,*reader,nfo);
        }
        else if (type == "Mat1") {
            ReadMat1_Binary(out,*reader,nfo);
        }
    /*  else if (type == "Bone") {
            ReadBone_Binary(out,*reader,nfo);
        }
        else if (type == "Chan") {
            ReadChan_Binary(out,*reader,nfo);
        }*/
        else if (type == "Unit") {
            ReadUnit_Binary(out,*reader,nfo);
        }
        else if (type == "OLay") {
            // ignore layer index silently.
            if(nfo.size != static_cast<unsigned int>(-1) ) {
                reader->IncPtr(nfo.size);
            }
            else return UnsupportedChunk_Binary(*reader,nfo,type.c_str());
        }
        else if (type == "END ") {
            return;
        }
        else UnsupportedChunk_Binary(*reader,nfo,type.c_str());
    }
}